

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O0

Word16 div_s(tetra_codec *st,Word16 var1,Word16 var2)

{
  Word32 L_var1;
  Word32 L_var2;
  short in_DX;
  short in_SI;
  tetra_codec *in_RDI;
  Word32 L_denom;
  Word32 L_num;
  Word16 iteration;
  Word16 var_out;
  Word16 in_stack_ffffffffffffffdc;
  Word16 in_stack_ffffffffffffffde;
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_2;
  
  local_16 = 0;
  if (((in_DX < in_SI) || (in_SI < 0)) || (in_DX < 0)) {
    local_2 = 0;
  }
  else if (in_DX == 0) {
    local_2 = 0;
  }
  else {
    if (in_SI == 0) {
      local_16 = 0;
    }
    else if (in_SI == in_DX) {
      local_16 = 0x7fff;
    }
    else {
      L_var1 = L_deposit_l(in_SI);
      L_var2 = L_deposit_l(in_DX);
      for (local_18 = 0; local_18 < 0xf; local_18 = local_18 + 1) {
        local_16 = local_16 << 1;
        L_var1 = L_var1 << 1;
        if (L_var2 <= L_var1) {
          L_var1 = L_sub(in_RDI,L_var1,L_var2);
          local_16 = add((tetra_codec *)CONCAT44(L_var1,L_var2),in_stack_ffffffffffffffde,
                         in_stack_ffffffffffffffdc);
        }
      }
    }
    local_2 = local_16;
  }
  return local_2;
}

Assistant:

Word16 div_s(tetra_codec* st, Word16 var1, Word16 var2)
  {
   Word16 var_out = 0;
   Word16 iteration;
   Word32 L_num;
   Word32 L_denom;

   if ((var1 > var2) || (var1 < 0) || (var2 < 0))
     {
      //printf("Division Error\n");
      //exit(0);
	  return 0;
     }

   if (var2 == 0)
     {
      //printf("Division by 0, Fatal error \n");
      //exit(0);
	  return 0;
     }

   if (var1 == 0)
     {
      var_out = 0;
     }
   else
     {
      if (var1 == var2)
 {
  var_out = MAX_16;
 }
      else
 {
  L_num = L_deposit_l(var1);
  L_denom = L_deposit_l(var2);

  for(iteration=0;iteration<15;iteration++)
    {
     var_out <<=1;
     L_num <<= 1;

     if (L_num >= L_denom)
       {
        L_num = L_sub(st, L_num,L_denom);
        var_out = add(st,  var_out,(Word16)1 );
       }
    }
 }
     }

   return(var_out);
  }